

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveOrderByTermToExprList(Parse *pParse,Select *pSelect,Expr *pE)

{
  u8 uVar1;
  anon_union_8_4_82a96254_for_uNC aVar2;
  sqlite3 *psVar3;
  int iVar4;
  uint uVar5;
  ExprList_item *pEVar6;
  int iVar7;
  long lVar8;
  long in_FS_OFFSET;
  NameContext nc;
  NameContext local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  aVar2 = (anon_union_8_4_82a96254_for_uNC)pSelect->pEList;
  local_68.nRef = 0;
  local_68.nNestedSelect = 0;
  local_68.pNext = (NameContext *)0x0;
  local_68.pWinSelect = (Select *)0x0;
  local_68.pSrcList = pSelect->pSrc;
  local_68.nNcErr = 0;
  local_68.ncFlags = 0x80081;
  psVar3 = pParse->db;
  uVar1 = psVar3->suppressErr;
  psVar3->suppressErr = '\x01';
  local_68.pParse = pParse;
  local_68.uNC = aVar2;
  iVar4 = sqlite3ResolveExprNames(&local_68,pE);
  psVar3->suppressErr = uVar1;
  iVar7 = 0;
  if ((iVar4 == 0) && (iVar7 = 0, 0 < (aVar2.pEList)->nExpr)) {
    pEVar6 = (aVar2.pEList)->a;
    lVar8 = 0;
    do {
      uVar5 = sqlite3ExprCompare((Parse *)0x0,pEVar6->pExpr,pE,-1);
      if (uVar5 < 2) {
        iVar7 = (int)lVar8 + 1;
        goto LAB_00187d82;
      }
      lVar8 = lVar8 + 1;
      pEVar6 = pEVar6 + 1;
    } while (lVar8 < (aVar2.pEList)->nExpr);
    iVar7 = 0;
  }
LAB_00187d82:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

static int resolveOrderByTermToExprList(
  Parse *pParse,     /* Parsing context for error messages */
  Select *pSelect,   /* The SELECT statement with the ORDER BY clause */
  Expr *pE           /* The specific ORDER BY term */
){
  int i;             /* Loop counter */
  ExprList *pEList;  /* The columns of the result set */
  NameContext nc;    /* Name context for resolving pE */
  sqlite3 *db;       /* Database connection */
  int rc;            /* Return code from subprocedures */
  u8 savedSuppErr;   /* Saved value of db->suppressErr */

  assert( sqlite3ExprIsInteger(pE, &i, 0)==0 );
  pEList = pSelect->pEList;

  /* Resolve all names in the ORDER BY term expression
  */
  memset(&nc, 0, sizeof(nc));
  nc.pParse = pParse;
  nc.pSrcList = pSelect->pSrc;
  nc.uNC.pEList = pEList;
  nc.ncFlags = NC_AllowAgg|NC_UEList|NC_NoSelect;
  nc.nNcErr = 0;
  db = pParse->db;
  savedSuppErr = db->suppressErr;
  db->suppressErr = 1;
  rc = sqlite3ResolveExprNames(&nc, pE);
  db->suppressErr = savedSuppErr;
  if( rc ) return 0;

  /* Try to match the ORDER BY expression against an expression
  ** in the result set.  Return an 1-based index of the matching
  ** result-set entry.
  */
  for(i=0; i<pEList->nExpr; i++){
    if( sqlite3ExprCompare(0, pEList->a[i].pExpr, pE, -1)<2 ){
      return i+1;
    }
  }

  /* If no match, return 0. */
  return 0;
}